

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Group.cpp
# Opt level: O0

void __thiscall Assimp::X3DImporter::ParseNode_Grouping_Transform(X3DImporter *this)

{
  CX3DImporter_NodeElement *pCVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  pointer pFVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_type sVar7;
  DeadlyImportError *pDVar8;
  float *pfVar9;
  ulong uVar10;
  float fVar11;
  aiVector3t<float> local_220;
  aiVector3t<float> local_214;
  aiVector3t<float> local_208;
  aiVector3t<float> local_1fc;
  CX3DImporter_NodeElement *local_1f0;
  CX3DImporter_NodeElement *ne;
  string local_1e0;
  undefined1 local_1c0 [8];
  vector<float,_std::allocator<float>_> tvec_1;
  string local_1a0;
  undefined1 local_180 [8];
  vector<float,_std::allocator<float>_> tvec;
  undefined1 local_160 [8];
  string an;
  uint local_12c;
  int idx_end;
  int idx;
  string def;
  string use;
  aiMatrix4x4 tmatr;
  aiMatrix4x4 matr;
  aiVector3D translation;
  float scale_orientation [4];
  aiVector3D scale;
  float rotation [4];
  undefined1 local_1c [8];
  aiVector3D center;
  X3DImporter *this_local;
  
  center._4_8_ = this;
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_1c,0.0,0.0,0.0);
  scale.y = 0.0;
  scale.z = 0.0;
  rotation[0] = 1.0;
  rotation[1] = 0.0;
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)(scale_orientation + 3),1.0,1.0,1.0);
  translation.y = 0.0;
  translation.z = 0.0;
  scale_orientation[0] = 1.0;
  scale_orientation[1] = 0.0;
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&matr.d3,0.0,0.0,0.0);
  aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&tmatr.d3);
  aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)((long)&use.field_2 + 0xc));
  std::__cxx11::string::string((string *)(def.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&idx_end);
  local_12c = 0;
  pFVar6 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  iVar3 = (*(pFVar6->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  do {
    if (iVar3 <= (int)local_12c) {
      uVar10 = std::__cxx11::string::empty();
      if ((uVar10 & 1) == 0) {
        local_1f0 = (CX3DImporter_NodeElement *)0x0;
        XML_CheckNode_MustBeEmpty(this);
        uVar10 = std::__cxx11::string::empty();
        if ((uVar10 & 1) == 0) {
          Throw_DEF_And_USE(this);
        }
        bVar2 = FindNodeElement(this,(string *)((long)&def.field_2 + 8),ENET_Group,&local_1f0);
        if (!bVar2) {
          Throw_USE_NotFound(this,(string *)((long)&def.field_2 + 8));
        }
        std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
        ::push_back(&this->NodeElement_Cur->Child,&local_1f0);
      }
      else {
        ParseHelper_Group_Begin(this,false);
        uVar10 = std::__cxx11::string::empty();
        if ((uVar10 & 1) == 0) {
          std::__cxx11::string::operator=((string *)&this->NodeElement_Cur->ID,(string *)&idx_end);
        }
        aiMatrix4x4t<float>::Translation
                  ((aiVector3t<float> *)&matr.d3,(aiMatrix4x4t<float> *)&tmatr.d3);
        aiMatrix4x4t<float>::Translation
                  ((aiVector3t<float> *)local_1c,(aiMatrix4x4t<float> *)((long)&use.field_2 + 0xc));
        aiMatrix4x4t<float>::operator*=
                  ((aiMatrix4x4t<float> *)&tmatr.d3,
                   (aiMatrix4x4t<float> *)((long)&use.field_2 + 0xc));
        aiVector3t<float>::aiVector3t(&local_1fc,scale.y,scale.z,rotation[0]);
        aiMatrix4x4t<float>::Rotation
                  (rotation[1],&local_1fc,(aiMatrix4x4t<float> *)((long)&use.field_2 + 0xc));
        aiMatrix4x4t<float>::operator*=
                  ((aiMatrix4x4t<float> *)&tmatr.d3,
                   (aiMatrix4x4t<float> *)((long)&use.field_2 + 0xc));
        fVar11 = scale_orientation[1];
        aiVector3t<float>::aiVector3t(&local_208,translation.y,translation.z,scale_orientation[0]);
        aiMatrix4x4t<float>::Rotation
                  (fVar11,&local_208,(aiMatrix4x4t<float> *)((long)&use.field_2 + 0xc));
        aiMatrix4x4t<float>::operator*=
                  ((aiMatrix4x4t<float> *)&tmatr.d3,
                   (aiMatrix4x4t<float> *)((long)&use.field_2 + 0xc));
        aiMatrix4x4t<float>::Scaling
                  ((aiVector3t<float> *)(scale_orientation + 3),
                   (aiMatrix4x4t<float> *)((long)&use.field_2 + 0xc));
        aiMatrix4x4t<float>::operator*=
                  ((aiMatrix4x4t<float> *)&tmatr.d3,
                   (aiMatrix4x4t<float> *)((long)&use.field_2 + 0xc));
        fVar11 = -scale_orientation[1];
        aiVector3t<float>::aiVector3t(&local_214,translation.y,translation.z,scale_orientation[0]);
        aiMatrix4x4t<float>::Rotation
                  (fVar11,&local_214,(aiMatrix4x4t<float> *)((long)&use.field_2 + 0xc));
        aiMatrix4x4t<float>::operator*=
                  ((aiMatrix4x4t<float> *)&tmatr.d3,
                   (aiMatrix4x4t<float> *)((long)&use.field_2 + 0xc));
        local_220 = ::operator-((aiVector3t<float> *)local_1c);
        aiMatrix4x4t<float>::Translation
                  (&local_220,(aiMatrix4x4t<float> *)((long)&use.field_2 + 0xc));
        aiMatrix4x4t<float>::operator*=
                  ((aiMatrix4x4t<float> *)&tmatr.d3,
                   (aiMatrix4x4t<float> *)((long)&use.field_2 + 0xc));
        pCVar1 = this->NodeElement_Cur;
        pCVar1[1].Parent = (CX3DImporter_NodeElement *)matr._40_8_;
        pCVar1[1].Child.
        super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
        _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)matr._48_8_;
        pCVar1[1].ID.field_2._M_allocated_capacity = matr._24_8_;
        *(undefined8 *)((long)&pCVar1[1].ID.field_2 + 8) = matr._32_8_;
        *(undefined8 *)&pCVar1[1].ID = matr._8_8_;
        pCVar1[1].ID._M_string_length = matr._16_8_;
        pCVar1[1]._vptr_CX3DImporter_NodeElement = (_func_int **)tmatr._56_8_;
        pCVar1[1].Type = (EType)matr.a1;
        *(float *)&pCVar1[1].field_0xc = matr.a2;
        pFVar6 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                 operator->(&this->mReader);
        uVar5 = (*(pFVar6->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])()
        ;
        if ((uVar5 & 1) != 0) {
          ParseHelper_Node_Exit(this);
        }
      }
      std::__cxx11::string::~string((string *)&idx_end);
      std::__cxx11::string::~string((string *)(def.field_2._M_local_buf + 8));
      return;
    }
    pFVar6 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar4 = (*(pFVar6->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar6,(ulong)local_12c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_160,(char *)CONCAT44(extraout_var,iVar4),
               (allocator<char> *)
               ((long)&tvec.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&tvec.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_160,"DEF");
    if (bVar2) {
      pFVar6 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                         (&this->mReader);
      iVar4 = (*(pFVar6->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                        (pFVar6,(ulong)local_12c);
      std::__cxx11::string::operator=((string *)&idx_end,(char *)CONCAT44(extraout_var_00,iVar4));
      tvec.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 4;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_160,"USE");
      if (bVar2) {
        pFVar6 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                 operator->(&this->mReader);
        iVar4 = (*(pFVar6->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                          (pFVar6,(ulong)local_12c);
        std::__cxx11::string::operator=
                  ((string *)(def.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var_01,iVar4))
        ;
        tvec.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ = 4;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_160,"bboxCenter");
        if (bVar2) {
          tvec.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._0_4_ = 4;
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_160,"bboxSize");
          if (bVar2) {
            tvec.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._0_4_ = 4;
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_160,"containerField");
            if (bVar2) {
              tvec.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage._0_4_ = 4;
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_160,"center");
              if (bVar2) {
                XML_ReadNode_GetAttrVal_AsVec3f(this,local_12c,(aiVector3D *)local_1c);
                tvec.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
              }
              else {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_160,"scale");
                if (bVar2) {
                  XML_ReadNode_GetAttrVal_AsVec3f
                            (this,local_12c,(aiVector3D *)(scale_orientation + 3));
                  tvec.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
                }
                else {
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_160,"translation");
                  if (bVar2) {
                    XML_ReadNode_GetAttrVal_AsVec3f(this,local_12c,(aiVector3D *)&matr.d3);
                    tvec.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
                  }
                  else {
                    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_160,"rotation");
                    if (bVar2) {
                      std::vector<float,_std::allocator<float>_>::vector
                                ((vector<float,_std::allocator<float>_> *)local_180);
                      XML_ReadNode_GetAttrVal_AsArrF
                                (this,local_12c,(vector<float,_std::allocator<float>_> *)local_180);
                      sVar7 = std::vector<float,_std::allocator<float>_>::size
                                        ((vector<float,_std::allocator<float>_> *)local_180);
                      if (sVar7 != 4) {
                        tvec_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
                        pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_1a0,
                                   "<Transform>: rotation vector must have 4 elements.",
                                   (allocator<char> *)
                                   ((long)&tvec_1.super__Vector_base<float,_std::allocator<float>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                        DeadlyImportError::DeadlyImportError(pDVar8,&local_1a0);
                        tvec_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
                        __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,
                                    DeadlyImportError::~DeadlyImportError);
                      }
                      pfVar9 = std::vector<float,_std::allocator<float>_>::data
                                         ((vector<float,_std::allocator<float>_> *)local_180);
                      scale.y = pfVar9[0];
                      scale.z = pfVar9[1];
                      rotation._0_8_ = *(undefined8 *)(pfVar9 + 2);
                      tvec.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
                      std::vector<float,_std::allocator<float>_>::~vector
                                ((vector<float,_std::allocator<float>_> *)local_180);
                    }
                    else {
                      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_160,"scaleOrientation");
                      if (bVar2) {
                        std::vector<float,_std::allocator<float>_>::vector
                                  ((vector<float,_std::allocator<float>_> *)local_1c0);
                        XML_ReadNode_GetAttrVal_AsArrF
                                  (this,local_12c,(vector<float,_std::allocator<float>_> *)local_1c0
                                  );
                        sVar7 = std::vector<float,_std::allocator<float>_>::size
                                          ((vector<float,_std::allocator<float>_> *)local_1c0);
                        if (sVar7 != 4) {
                          ne._6_1_ = 1;
                          pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_1e0,
                                     "<Transform>: scaleOrientation vector must have 4 elements.",
                                     (allocator<char> *)((long)&ne + 7));
                          DeadlyImportError::DeadlyImportError(pDVar8,&local_1e0);
                          ne._6_1_ = 0;
                          __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,
                                      DeadlyImportError::~DeadlyImportError);
                        }
                        pfVar9 = std::vector<float,_std::allocator<float>_>::data
                                           ((vector<float,_std::allocator<float>_> *)local_1c0);
                        translation.y = pfVar9[0];
                        translation.z = pfVar9[1];
                        scale_orientation._0_8_ = *(undefined8 *)(pfVar9 + 2);
                        tvec.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
                        std::vector<float,_std::allocator<float>_>::~vector
                                  ((vector<float,_std::allocator<float>_> *)local_1c0);
                      }
                      else {
                        Throw_IncorrectAttr(this,(string *)local_160);
                        tvec.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_160);
    local_12c = local_12c + 1;
  } while( true );
}

Assistant:

void X3DImporter::ParseNode_Grouping_Transform()
{
    aiVector3D center(0, 0, 0);
    float rotation[4] = {0, 0, 1, 0};
    aiVector3D scale(1, 1, 1);// A value of zero indicates that any child geometry shall not be displayed
    float scale_orientation[4] = {0, 0, 1, 0};
    aiVector3D translation(0, 0, 0);
    aiMatrix4x4 matr, tmatr;
    std::string use, def;

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_REF("center", center, XML_ReadNode_GetAttrVal_AsVec3f);
		MACRO_ATTRREAD_CHECK_REF("scale", scale, XML_ReadNode_GetAttrVal_AsVec3f);
		MACRO_ATTRREAD_CHECK_REF("translation", translation, XML_ReadNode_GetAttrVal_AsVec3f);
		if(an == "rotation")
		{
			std::vector<float> tvec;

			XML_ReadNode_GetAttrVal_AsArrF(idx, tvec);
			if(tvec.size() != 4) throw DeadlyImportError("<Transform>: rotation vector must have 4 elements.");

			memcpy(rotation, tvec.data(), sizeof(rotation));

			continue;
		}

		if(an == "scaleOrientation")
		{
			std::vector<float> tvec;
			XML_ReadNode_GetAttrVal_AsArrF(idx, tvec);
            if ( tvec.size() != 4 )
            {
                throw DeadlyImportError( "<Transform>: scaleOrientation vector must have 4 elements." );
            }

			::memcpy(scale_orientation, tvec.data(), sizeof(scale_orientation) );

			continue;
		}

	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		CX3DImporter_NodeElement* ne( nullptr );

		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Group, ne);
	}
	else
	{
		ParseHelper_Group_Begin();// create new grouping element and go deeper if node has children.
		// at this place new group mode created and made current, so we can name it.
        if ( !def.empty() )
        {
            NodeElement_Cur->ID = def;
        }

		//
		// also set values specific to this type of group
		//
		// calculate transformation matrix
		aiMatrix4x4::Translation(translation, matr);// T
		aiMatrix4x4::Translation(center, tmatr);// C
		matr *= tmatr;
		aiMatrix4x4::Rotation(rotation[3], aiVector3D(rotation[0], rotation[1], rotation[2]), tmatr);// R
		matr *= tmatr;
		aiMatrix4x4::Rotation(scale_orientation[3], aiVector3D(scale_orientation[0], scale_orientation[1], scale_orientation[2]), tmatr);// SR
		matr *= tmatr;
		aiMatrix4x4::Scaling(scale, tmatr);// S
		matr *= tmatr;
		aiMatrix4x4::Rotation(-scale_orientation[3], aiVector3D(scale_orientation[0], scale_orientation[1], scale_orientation[2]), tmatr);// -SR
		matr *= tmatr;
		aiMatrix4x4::Translation(-center, tmatr);// -C
		matr *= tmatr;
		// and assign it
		((CX3DImporter_NodeElement_Group*)NodeElement_Cur)->Transformation = matr;
		// in grouping set of nodes check X3DMetadataObject is not needed, because it is done in <Scene> parser function.

		// for empty element exit from node in that place
        if ( mReader->isEmptyElement() )
        {
            ParseHelper_Node_Exit();
        }
	}// if(!use.empty()) else
}